

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,IndexVector *v)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  wostream *pwVar4;
  uint local_1c;
  uint i;
  IndexVector *v_local;
  wostream *os_local;
  
  std::operator<<(os,L'[');
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      (&v->super_vector<int,_std::allocator<int>_>);
    if (sVar2 - 1 <= (ulong)local_1c) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&v->super_vector<int,_std::allocator<int>_>,(ulong)local_1c);
    pwVar4 = (wostream *)std::wostream::operator<<(os,*pvVar3);
    std::operator<<(pwVar4,L',');
    local_1c = local_1c + 1;
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&v->super_vector<int,_std::allocator<int>_>)
  ;
  if (!bVar1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::back
                       (&v->super_vector<int,_std::allocator<int>_>);
    std::wostream::operator<<(os,*pvVar3);
  }
  std::operator<<(os,L']');
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const IndexVector& v)
{
    os << L'[';
    for (unsigned int i = 0; i < v.size() - 1; i++)
    {
        os << v[i] << L',';
    }
    if (!v.empty())
        os << v.back();
    os << L']';
    return os;
}